

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::usda::USDAReader::Impl::ReconstructStage(Impl *this)

{
  size_t *psVar1;
  bool bVar2;
  size_t *psVar3;
  storage_union local_398;
  undefined **local_388;
  Prim prim;
  
  ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::clear
            ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
  psVar3 = (this->_toplevel_prims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->_toplevel_prims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar3 == psVar1) {
      Stage::compute_absolute_prim_path_and_assign_prim_id(&this->_stage,true);
LAB_00125e86:
      return psVar3 == psVar1;
    }
    local_388 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_398.dynamic = (void *)0x0;
    Prim::Prim(&prim,(Value *)&local_398);
    if (local_388 != (undefined **)0x0) {
      (*(code *)local_388[4])(&local_398);
    }
    bVar2 = anon_unknown_1::ConstructPrimTreeRec(*psVar3,&this->_prim_nodes,&prim,&this->_err);
    if (!bVar2) {
      Prim::~Prim(&prim);
      goto LAB_00125e86;
    }
    ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this,&prim);
    Prim::~Prim(&prim);
    psVar3 = psVar3 + 1;
  } while( true );
}

Assistant:

bool USDAReader::Impl::ReconstructStage() {
  _stage.root_prims().clear();

  for (const auto &idx : _toplevel_prims) {
    DCOUT("Toplevel prim idx: " << std::to_string(idx));

    Prim prim(value::Value(nullptr)); // init with dummy Prim
    if (!ConstructPrimTreeRec(idx, _prim_nodes, &prim, &_err)) {
      return false;
    }

    _stage.root_prims().emplace_back(std::move(prim));

    DCOUT("num_children = " << _stage.root_prims()[size_t(_stage.root_prims().size() - 1)].children().size());
  }

  // Compute Abs Path from built Prim tree and Assign prim id.
  _stage.compute_absolute_prim_path_and_assign_prim_id();

  return true;
}